

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O2

void comex_igroup_finalize(comex_igroup_t *igroup)

{
  int iVar1;
  
  if (igroup->group != (MPI_Group)&ompi_mpi_group_null) {
    iVar1 = MPI_Group_free(&igroup->group);
    if (iVar1 != 0) {
      comex_error("MPI_Group_free: Failed ",iVar1);
    }
  }
  if (igroup->comm != (MPI_Comm)&ompi_mpi_comm_null) {
    iVar1 = MPI_Comm_free(&igroup->comm);
    if (iVar1 != 0) {
      comex_error("MPI_Comm_free: Failed ",iVar1);
      return;
    }
  }
  return;
}

Assistant:

static void comex_igroup_finalize(comex_igroup_t *igroup)
{
    int status;

    assert(igroup);

    if (igroup->group != MPI_GROUP_NULL) {
        status = MPI_Group_free(&igroup->group);
        if (status != MPI_SUCCESS) {
            comex_error("MPI_Group_free: Failed ", status);
        }
    }
    
    if (igroup->comm != MPI_COMM_NULL) {
        status = MPI_Comm_free(&igroup->comm);
        if (status != MPI_SUCCESS) {
            comex_error("MPI_Comm_free: Failed ", status);
        }
    }
}